

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_make_transformation_scalingv3(matrix4 *self,vector3 *scale)

{
  vector3 *scale_local;
  matrix4 *self_local;
  
  matrix4_identity(self);
  (self->field_0).m[0] = (scale->field_0).v[0];
  (self->field_0).m[5] = (scale->field_0).v[1];
  (self->field_0).m[10] = (scale->field_0).v[2];
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_scalingv3(struct matrix4 *self, const struct vector3 *scale)
{
	matrix4_identity(self);

	self->c00 = scale->x;
	self->c11 = scale->y;
	self->c22 = scale->z;

	return self;
}